

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O0

void Rnm_ManVerifyUsingTerSim
               (Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vMap,Vec_Int_t *vObjs,Vec_Int_t *vRes)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_44;
  int local_40;
  int iBit;
  int f;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRes_local;
  Vec_Int_t *vObjs_local;
  Vec_Int_t *vMap_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  local_44 = pCex->nRegs;
  pGVar3 = Gia_ManConst0(p);
  Gia_ObjTerSimSet0(pGVar3);
  for (local_40 = 0; local_40 <= pCex->iFrame; local_40 = local_40 + 1) {
    iBit = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vMap);
      bVar4 = false;
      if (iBit < iVar1) {
        iVar1 = Vec_IntEntry(vMap,iBit);
        _f = Gia_ManObj(p,iVar1);
        bVar4 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      uVar2 = Abc_InfoHasBit((uint *)(pCex + 1),local_44 + iBit);
      _f->Value = uVar2;
      iVar1 = Gia_ObjIsPi(p,_f);
      if (iVar1 == 0) {
        Gia_ObjTerSimSetX(_f);
      }
      else if (_f->Value == 0) {
        Gia_ObjTerSimSet0(_f);
      }
      else {
        Gia_ObjTerSimSet1(_f);
      }
      iBit = iBit + 1;
    }
    iBit = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vRes);
      bVar4 = false;
      if (iBit < iVar1) {
        iVar1 = Vec_IntEntry(vRes,iBit);
        _f = Gia_ManObj(p,iVar1);
        bVar4 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      if (_f->Value == 0) {
        Gia_ObjTerSimSet0(_f);
      }
      else {
        Gia_ObjTerSimSet1(_f);
      }
      iBit = iBit + 1;
    }
    iBit = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vObjs);
      bVar4 = false;
      if (iBit < iVar1) {
        iVar1 = Vec_IntEntry(vObjs,iBit);
        _f = Gia_ManObj(p,iVar1);
        bVar4 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjIsCo(_f);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(_f);
        if (iVar1 == 0) {
          if (local_40 == 0) {
            Gia_ObjTerSimSet0(_f);
          }
          else {
            Gia_ObjTerSimRo(p,_f);
          }
        }
        else {
          Gia_ObjTerSimAnd(_f);
        }
      }
      else {
        Gia_ObjTerSimCo(_f);
      }
      iBit = iBit + 1;
    }
    local_44 = pCex->nPis + local_44;
  }
  iBit = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vMap);
    bVar4 = false;
    if (iBit < iVar1) {
      iVar1 = Vec_IntEntry(vMap,iBit);
      _f = Gia_ManObj(p,iVar1);
      bVar4 = _f != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    _f->Value = 0;
    iBit = iBit + 1;
  }
  pGVar3 = Gia_ManPo(p,0);
  iVar1 = Gia_ObjTerSimGet1(pGVar3);
  if (iVar1 == 0) {
    Abc_Print(1,"\nRefinement verification has failed!!!\n");
  }
  return;
}

Assistant:

void Rnm_ManVerifyUsingTerSim( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vMap, Vec_Int_t * vObjs, Vec_Int_t * vRes )
{
    Gia_Obj_t * pObj;
    int i, f, iBit = pCex->nRegs;
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    for ( f = 0; f <= pCex->iFrame; f++, iBit += pCex->nPis )
    {
        Gia_ManForEachObjVec( vMap, p, pObj, i )
        {
            pObj->Value = Abc_InfoHasBit( pCex->pData, iBit + i );
            if ( !Gia_ObjIsPi(p, pObj) )
                Gia_ObjTerSimSetX( pObj );
            else if ( pObj->Value )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachObjVec( vRes, p, pObj, i ) // vRes is subset of vMap
        {
            if ( pObj->Value )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachObjVec( vObjs, p, pObj, i )
        {
            if ( Gia_ObjIsCo(pObj) )
                Gia_ObjTerSimCo( pObj );
            else if ( Gia_ObjIsAnd(pObj) )
                Gia_ObjTerSimAnd( pObj );
            else if ( f == 0 )
                Gia_ObjTerSimSet0( pObj );
            else
                Gia_ObjTerSimRo( p, pObj );
        }
    }
    Gia_ManForEachObjVec( vMap, p, pObj, i )
        pObj->Value = 0;
    pObj = Gia_ManPo( p, 0 );
    if ( !Gia_ObjTerSimGet1(pObj) )
        Abc_Print( 1, "\nRefinement verification has failed!!!\n" );
}